

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_custom_notification_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  _func_int *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _func_int **pp_Var6;
  buffer *buf;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar7;
  element_type *this_01;
  element_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 auVar10 [16];
  ptr<custom_notification_msg> pVar11;
  ptr<resp_msg> pVar12;
  ptr<custom_notification_msg> msg_00;
  ptr<custom_notification_msg> msg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  ptr<resp_msg> local_70;
  ptr<resp_msg> local_60;
  element_type *local_50;
  element_type *local_48;
  ptr<resp_msg> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  
  p_Var4 = req[9].super_msg_base._vptr_msg_base[1];
  uVar1 = *(undefined4 *)
           ((long)&(in_RDX->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 4);
  uVar7 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
  this_01 = (element_type *)operator_new(0xb0);
  (this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  this_01->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_00236208;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this_01->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var4;
  *(undefined4 *)&(this_01->bg_append_thread_)._M_id._M_thread = 0x1d;
  *(undefined4 *)((long)&(this_01->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(undefined4 *)&this_01->bg_append_ea_ = uVar1;
  (this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_00236258;
  *(undefined8 *)&(this_01->initialized_)._M_base = uVar7;
  this_01->id_ = 0;
  this_01->my_priority_ = 0;
  *(undefined1 *)&this_01->target_priority_ = 0;
  (this_01->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (this_01->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  this_01->votes_responded_ = 0;
  this_01->votes_granted_ = 0;
  (this_01->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(this_01->priority_change_timer_).first_event_fired_ = 0;
  (this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (this_01->priority_change_timer_).t_created_.__d.__r = 0;
  (this_01->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(this_01->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  auVar10 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
  _Var8._M_pi = auVar10._8_8_;
  peVar9 = (element_type *)
           &(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(long *)&(this_01->initialized_)._M_base = auVar10._0_8_;
  *(undefined1 *)&this_01->target_priority_ = 1;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           in_RDX[2].ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (in_RDX[2].ctx_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi == p_Var5) {
    this->_vptr_raft_server = (_func_int **)peVar9;
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
    this_01 = (element_type *)0x0;
    goto LAB_001db5d7;
  }
  pp_Var6 = p_Var5->_vptr__Sp_counted_base;
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var5->_M_use_count;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  buf = (buffer *)pp_Var6[2];
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var6[3];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (buf == (buffer *)0x0) {
    this->_vptr_raft_server = (_func_int **)peVar9;
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
    this_01 = (element_type *)0x0;
  }
  else {
    pVar11 = custom_notification_msg::deserialize((custom_notification_msg *)&local_80,buf);
    this_03._M_pi = local_78;
    _Var8 = pVar11.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    iVar3 = *(int *)&(local_80._M_pi)->_vptr__Sp_counted_base;
    if (iVar3 == 1) {
      local_40.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_80._M_pi;
      local_40.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_78;
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_78->_M_use_count = local_78->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_78->_M_use_count = local_78->_M_use_count + 1;
        }
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                 super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                 super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
      local_50 = peVar9;
      local_48 = this_01;
      pVar12 = handle_out_of_log_msg(this,req,(ptr<custom_notification_msg> *)in_RDX,&local_40);
      _Var8 = pVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      this_03._M_pi =
           local_40.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_48 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
        _Var8._M_pi = extraout_RDX;
        this_03._M_pi =
             local_40.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      }
LAB_001db5a4:
      if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
        _Var8._M_pi = extraout_RDX_01;
      }
    }
    else {
      if (iVar3 == 2) {
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_78->_M_use_count = local_78->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_78->_M_use_count = local_78->_M_use_count + 1;
          }
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
          UNLOCK();
        }
        else {
          *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
        }
        pVar11.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_80._M_pi;
        pVar11.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = in_RDX;
        local_60.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar9;
        local_60.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
        pVar12 = handle_leadership_takeover(this,req,pVar11,&local_60);
        _Var8 = pVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        this_02._M_pi =
             local_60.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
LAB_001db595:
        if ((element_type *)this_02._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
          _Var8._M_pi = extraout_RDX_00;
        }
        goto LAB_001db5a4;
      }
      if (iVar3 == 3) {
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_78->_M_use_count = local_78->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_78->_M_use_count = local_78->_M_use_count + 1;
          }
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
          UNLOCK();
        }
        else {
          *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
        }
        msg_00.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_80._M_pi;
        msg_00.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = in_RDX;
        local_70.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar9;
        local_70.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01;
        pVar12 = handle_resignation_request(this,req,msg_00,&local_70);
        _Var8 = pVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        this_02._M_pi =
             local_70.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        goto LAB_001db595;
      }
      this->_vptr_raft_server = (_func_int **)peVar9;
      (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
      this_01 = (element_type *)0x0;
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      _Var8._M_pi = extraout_RDX_02;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var8._M_pi = extraout_RDX_03;
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    _Var8._M_pi = extraout_RDX_04;
  }
LAB_001db5d7:
  if (this_01 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    _Var8._M_pi = extraout_RDX_05;
  }
  pVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  pVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_custom_notification_req(req_msg& req) {
    ptr<resp_msg> resp = cs_new<resp_msg>( state_->get_term(),
                                           msg_type::custom_notification_response,
                                           id_,
                                           req.get_src(),
                                           log_store_->next_slot() );
    resp->accept(log_store_->next_slot());

    std::vector< ptr<log_entry> >& log_entries = req.log_entries();
    if (!log_entries.size()) {
        // Empty message, just return.
        return resp;
    }

    ptr<log_entry> msg_le = log_entries[0];
    ptr<buffer> buf = msg_le->get_buf_ptr();
    if (!buf) return resp;

    ptr<custom_notification_msg> msg = custom_notification_msg::deserialize(*buf);

    switch (msg->type_) {
    case custom_notification_msg::out_of_log_range_warning: {
        return handle_out_of_log_msg(req, msg, resp);
    }
    case custom_notification_msg::leadership_takeover: {
        return handle_leadership_takeover(req, msg, resp);
    }
    case custom_notification_msg::request_resignation: {
        return handle_resignation_request(req, msg, resp);
    }
    default:
        break;
    }

    return resp;
}